

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_rotli_i64_sparc(TCGContext_conflict7 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,uint arg2)

{
  uintptr_t o_2;
  TCGv_i64 pTVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  uintptr_t o;
  
  if (arg2 != 0) {
    pTVar1 = tcg_const_i64_sparc(tcg_ctx,(ulong)arg2);
    pTVar2 = tcg_emit_op_sparc(tcg_ctx,INDEX_op_rotl_i64);
    pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar2->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    pTVar2->args[2] = (TCGArg)(pTVar1 + (long)tcg_ctx);
    tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return;
  }
  if (ret != arg1) {
    pTVar2 = tcg_emit_op_sparc(tcg_ctx,INDEX_op_mov_i64);
    pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar2->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  }
  return;
}

Assistant:

void tcg_gen_rotli_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, unsigned arg2)
{
    tcg_debug_assert(arg2 < 64);
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
#if TCG_TARGET_HAS_rot_i64
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_rotl_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#else
        TCGv_i64 t0, t1;
        t0 = tcg_temp_new_i64(tcg_ctx);
        t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shli_i64(tcg_ctx, t0, arg1, arg2);
        tcg_gen_shri_i64(tcg_ctx, t1, arg1, 64 - arg2);
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
#endif
    }
}